

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  size_t width_10;
  size_t width_11;
  TimeInMillis ms_01;
  size_t width_12;
  TimeInMillis ms_02;
  size_t width_13;
  size_t width_14;
  size_t width_15;
  size_t width_16;
  size_t width_17;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  Indent_abi_cxx11_(&local_98,(internal *)0x4,in_RDX);
  poVar1 = std::operator<<(stream,(string *)&local_98);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testsuite",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"name",&local_9a);
  std::__cxx11::string::string((string *)&local_58,"NonTestSuiteFailure",&local_99);
  Indent_abi_cxx11_(&local_38,(internal *)0x6,width);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"tests",&local_9b);
  Indent_abi_cxx11_(&local_58,(internal *)0x6,width_00);
  OutputJsonKey(stream,&local_98,&local_78,1,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  width_07 = extraout_RDX;
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"failures",&local_9b);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_01);
    OutputJsonKey(stream,&local_98,&local_78,1,&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"disabled",&local_9b);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_02);
    OutputJsonKey(stream,&local_98,&local_78,0,&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"skipped",&local_9b);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_03);
    OutputJsonKey(stream,&local_98,&local_78,0,&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"errors",&local_9b);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_04);
    OutputJsonKey(stream,&local_98,&local_78,0,&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"testsuite",&local_9b);
    std::__cxx11::string::string((string *)&local_78,"time",&local_9a);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_58,(internal *)result->elapsed_time_,ms);
    Indent_abi_cxx11_(&local_38,(internal *)0x6,width_05);
    OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"testsuite",&local_9b);
    std::__cxx11::string::string((string *)&local_78,"timestamp",&local_9a);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_58,(internal *)result->start_timestamp_,ms_00);
    Indent_abi_cxx11_(&local_38,(internal *)0x6,width_06);
    OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    width_07 = extraout_RDX_00;
  }
  Indent_abi_cxx11_(&local_98,(internal *)0x6,width_07);
  poVar1 = std::operator<<(stream,(string *)&local_98);
  std::operator<<(poVar1,"\"testsuite\": [\n");
  std::__cxx11::string::~string((string *)&local_98);
  Indent_abi_cxx11_(&local_98,(internal *)0x8,width_08);
  poVar1 = std::operator<<(stream,(string *)&local_98);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"name",&local_9a);
  std::__cxx11::string::string((string *)&local_58,"",&local_99);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_09);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"status",&local_9a);
  std::__cxx11::string::string((string *)&local_58,"RUN",&local_99);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_10);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"result",&local_9a);
  std::__cxx11::string::string((string *)&local_58,"COMPLETED",&local_99);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_11);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"timestamp",&local_9a);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_58,(internal *)result->start_timestamp_,ms_01);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_12);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"time",&local_9a);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_58,(internal *)result->elapsed_time_,ms_02);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_13);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"classname",&local_9a);
  std::__cxx11::string::string((string *)&local_58,"",&local_99);
  Indent_abi_cxx11_(&local_38,(internal *)0xa,width_14);
  OutputJsonKey(stream,&local_98,&local_78,&local_58,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_15);
  TestPropertiesAsJson(&local_98,result,&local_78);
  std::operator<<(stream,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  OutputJsonTestResult(stream,result);
  poVar1 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_98,(internal *)0x6,width_16);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1,"]\n");
  Indent_abi_cxx11_(&local_78,(internal *)0x4,width_17);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}